

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask4_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 4 | *out;
  *out = in[2] << 8 | *out;
  *out = in[3] << 0xc | *out;
  *out = in[4] << 0x10 | *out;
  *out = in[5] << 0x14 | *out;
  *out = in[6] << 0x18 | *out;
  *out = in[7] << 0x1c | *out;
  puVar1 = out + 1;
  *puVar1 = in[8];
  *puVar1 = in[9] << 4 | *puVar1;
  *puVar1 = in[10] << 8 | *puVar1;
  *puVar1 = in[0xb] << 0xc | *puVar1;
  *puVar1 = in[0xc] << 0x10 | *puVar1;
  *puVar1 = in[0xd] << 0x14 | *puVar1;
  *puVar1 = in[0xe] << 0x18 | *puVar1;
  *puVar1 = in[0xf] << 0x1c | *puVar1;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask4_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;

  return out;
}